

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

c_int csc_cumsum(c_int *p,c_int *c,c_int n)

{
  c_int nz;
  c_int i;
  c_int n_local;
  c_int *c_local;
  c_int *p_local;
  c_int local_8;
  
  nz = 0;
  if ((p == (c_int *)0x0) || (c == (c_int *)0x0)) {
    local_8 = -1;
  }
  else {
    for (i = 0; i < n; i = i + 1) {
      p[i] = nz;
      nz = c[i] + nz;
      c[i] = p[i];
    }
    p[n] = nz;
    local_8 = nz;
  }
  return local_8;
}

Assistant:

c_int csc_cumsum(c_int *p, c_int *c, c_int n) {
  c_int i, nz = 0;

  if (!p || !c) return -1;  /* check inputs */

  for (i = 0; i < n; i++)
  {
    p[i] = nz;
    nz  += c[i];
    c[i] = p[i];
  }
  p[n] = nz;
  return nz; /* return sum (c [0..n-1]) */
}